

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::log_console_create(uint argc)

{
  uint *puVar1;
  vm_val_t *pvVar2;
  err_frame_t *peVar3;
  CVmException *pCVar4;
  int32_t width;
  ushort *puVar5;
  char *table_name;
  undefined4 extraout_var;
  CCharmapToLocal *cmap;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  undefined8 uVar7;
  CVmNetFile *nf;
  FILE *fp;
  long *plVar8;
  int iVar9;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  undefined4 extraout_var_01;
  
  CVmBif::check_argc(argc,3);
  pvVar2 = sp_;
  width = vm_val_t::num_to_int(sp_ + -3);
  cmap = G_cmap_to_log_X;
  if (pvVar2[-2].typ == VM_OBJ) {
    iVar9 = CVmObjCharSet::is_charset(pvVar2[-2].val.obj);
    if (iVar9 != 0) {
      cmap = CVmObjCharSet::get_to_local
                       ((CVmObjCharSet *)
                        (G_obj_table_X.pages_[pvVar2[-2].val.obj >> 0xc] +
                        (pvVar2[-2].val.obj & 0xfff)));
      puVar1 = &(cmap->super_CCharmap).ref_cnt_;
      *puVar1 = *puVar1 + 1;
      goto LAB_0025a072;
    }
  }
  else if (pvVar2[-2].typ == VM_NIL) {
    puVar1 = &(G_cmap_to_log_X->super_CCharmap).ref_cnt_;
    *puVar1 = *puVar1 + 1;
    goto LAB_0025a072;
  }
  puVar5 = (ushort *)vm_val_t::get_as_string(pvVar2 + -2);
  if (puVar5 == (ushort *)0x0) {
    err_throw(0x900);
  }
  table_name = lib_copy_str((char *)(puVar5 + 1),(ulong)*puVar5);
  iVar9 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
  cmap = CCharmapToLocal::load((CResLoader *)CONCAT44(extraout_var,iVar9),table_name);
  lib_free_str(table_name);
  if (cmap == (CCharmapToLocal *)0x0) {
    iVar9 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
    cmap = CCharmapToLocal::load((CResLoader *)CONCAT44(extraout_var_00,iVar9),"us-ascii");
  }
LAB_0025a072:
  puVar6 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar6;
  uVar7 = _ZTW11G_err_frame();
  *(err_frame_t **)uVar7 = &err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"logConsoleCreate");
    iVar9 = CVmNetFile::open((char *)(pvVar2 + -1),(int)&rc,0xe,2,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var_01,iVar9);
    CVmObjFile::check_safety_for_open(nf,2);
    fp = fopen(nf->lclfname,"w");
    if (fp == (FILE *)0x0) {
      CVmRun::throw_new_class
                (&G_interpreter_X,G_predef_X.file_creation_exc,0,"error creating log file");
    }
    iVar9 = CVmLogConsoleManager::create_log_console
                      (G_console_X->log_console_manager_,nf,(osfildef *)fp,cmap,width);
  }
  else {
    iVar9 = 0;
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    CCharmap::release_ref(&cmap->super_CCharmap);
  }
  peVar3 = err_cur__.prv_;
  puVar6 = (undefined8 *)_ZTW11G_err_frame();
  *puVar6 = peVar3;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar6 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar6 & 2) != 0) {
      plVar8 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar8 + 0x10));
    }
    pCVar4 = err_cur__.exc_;
    plVar8 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar8 + 0x10) = pCVar4;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  sp_ = sp_ + -(long)(int)argc;
  if (iVar9 == 0) {
    CVmBif::retval_nil();
  }
  else {
    CVmBif::retval_int((long)iVar9);
  }
  return;
}

Assistant:

void CVmBifTIO::log_console_create(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 3);

    /* get the arguments: log file name, character set, and width */
    const vm_val_t *filespec = G_stk->get(0);
    const vm_val_t *charset = G_stk->get(1);
    int width = G_stk->get(2)->num_to_int(vmg0_);

    /* 
     *   Retrieve the character mapper, which can be given as either a
     *   CharacterSet object or a string giving the character set name.  
     */
    CCharmapToLocal *cmap = 0;
    if (charset->typ == VM_NIL)
    {
        /* nil - use the default log file character set */
        cmap = G_cmap_to_log;
        cmap->add_ref();
    }
    else if (charset->typ == VM_OBJ
             && CVmObjCharSet::is_charset(vmg_ charset->val.obj))
    {
        /* it's a CharacterSet object - pop the reference */
        vm_obj_id_t obj = charset->val.obj;
        
        /* retrieve the character mapper from the character set */
        cmap = ((CVmObjCharSet *)vm_objp(vmg_ obj))->get_to_local(vmg0_);
        cmap->add_ref();
    }
    else
    {
        /* it's not a CharacterSet, so it must be a character set name */
        const char *str = charset->get_as_string(vmg0_);
        if (str == 0)
            err_throw(VMERR_BAD_TYPE_BIF);
        
        /* get the length and skip the length prefix */
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        /* get a null-terminated version of the name */
        char *nm = lib_copy_str(str, len);

        /* 
         *   Create a character mapping for the given name.  Note that this
         *   will automatically add a reference to the mapper on our behalf,
         *   so we don't have to add our own extra reference. 
         */
        cmap = CCharmapToLocal::load(G_host_ifc->get_sys_res_loader(), nm);

        /* done with the null-terminated version of the name string */
        lib_free_str(nm);
    }